

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.cpp
# Opt level: O0

bool __thiscall cornelich::region::position(region *this,int32_t position)

{
  int iVar1;
  bool bVar2;
  int32_t position_local;
  region *this_local;
  memory_order __b;
  
  bVar2 = position <= this->m_limit_offset;
  if (bVar2 && -1 < position) {
    iVar1 = this->m_start_offset;
    std::operator&(memory_order_relaxed,__memory_order_mask);
    (this->m_position_offset).super___atomic_base<int>._M_i = iVar1 + position;
  }
  this_local._7_1_ = bVar2 && -1 < position;
  return this_local._7_1_;
}

Assistant:

bool region::position(std::int32_t position)
{
    if(BOOST_UNLIKELY(position > m_limit_offset || position < 0))
        return false;
    m_position_offset.store(m_start_offset + position, std::memory_order_relaxed);
    return true;
}